

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-parser-internal.h
# Opt level: O0

Result<wasm::Ok> *
wasm::WATParser::parseDefs<wasm::WATParser::ParseDefsCtx>
          (Result<wasm::Ok> *__return_storage_ptr__,ParseDefsCtx *ctx,
          vector<wasm::WATParser::DefPos,_std::allocator<wasm::WATParser::DefPos>_> *defs,
          _func_MaybeResult<wasm::Ok>_ParseDefsCtx_ptr *parser)

{
  bool bVar1;
  reference pDVar2;
  Ok local_179;
  Err local_178;
  Err *local_158;
  Err *err_1;
  MaybeResult<wasm::Ok> _val_1;
  MaybeResult<wasm::Ok> im;
  Err local_f8;
  Err *local_d8;
  Err *err;
  MaybeResult<wasm::Ok> _val;
  undefined1 local_98 [8];
  MaybeResult<wasm::Ok> parsed;
  WithPosition<wasm::WATParser::ParseDefsCtx> with;
  DefPos *def;
  const_iterator __end2;
  const_iterator __begin2;
  vector<wasm::WATParser::DefPos,_std::allocator<wasm::WATParser::DefPos>_> *__range2;
  _func_MaybeResult<wasm::Ok>_ParseDefsCtx_ptr *parser_local;
  vector<wasm::WATParser::DefPos,_std::allocator<wasm::WATParser::DefPos>_> *defs_local;
  ParseDefsCtx *ctx_local;
  
  __end2 = std::vector<wasm::WATParser::DefPos,_std::allocator<wasm::WATParser::DefPos>_>::begin
                     (defs);
  def = (DefPos *)
        std::vector<wasm::WATParser::DefPos,_std::allocator<wasm::WATParser::DefPos>_>::end(defs);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_wasm::WATParser::DefPos_*,_std::vector<wasm::WATParser::DefPos,_std::allocator<wasm::WATParser::DefPos>_>_>
                                *)&def);
    if (!bVar1) {
      Result<wasm::Ok>::Result<wasm::Ok>(__return_storage_ptr__,&local_179);
      return __return_storage_ptr__;
    }
    pDVar2 = __gnu_cxx::
             __normal_iterator<const_wasm::WATParser::DefPos_*,_std::vector<wasm::WATParser::DefPos,_std::allocator<wasm::WATParser::DefPos>_>_>
             ::operator*(&__end2);
    ctx->index = pDVar2->index;
    WithPosition<wasm::WATParser::ParseDefsCtx>::WithPosition
              ((WithPosition<wasm::WATParser::ParseDefsCtx> *)
               ((long)&parsed.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20),ctx,
               pDVar2->pos);
    (*parser)((MaybeResult<wasm::Ok> *)local_98,ctx);
    bVar1 = wasm::MaybeResult::operator_cast_to_bool((MaybeResult *)local_98);
    if (bVar1) {
      MaybeResult<wasm::Ok>::MaybeResult
                ((MaybeResult<wasm::Ok> *)&err,(MaybeResult<wasm::Ok> *)local_98);
      local_d8 = MaybeResult<wasm::Ok>::getErr((MaybeResult<wasm::Ok> *)&err);
      bVar1 = local_d8 != (Err *)0x0;
      if (bVar1) {
        wasm::Err::Err(&local_f8,local_d8);
        Result<wasm::Ok>::Result(__return_storage_ptr__,&local_f8);
        wasm::Err::~Err(&local_f8);
      }
      MaybeResult<wasm::Ok>::~MaybeResult((MaybeResult<wasm::Ok> *)&err);
    }
    else {
      import_<wasm::WATParser::ParseDefsCtx>
                ((MaybeResult<wasm::Ok> *)
                 ((long)&_val_1.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20),ctx);
      bVar1 = wasm::MaybeResult::operator_cast_to_bool
                        ((MaybeResult *)
                         ((long)&_val_1.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                 super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                 super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                 super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                 super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20));
      if (!bVar1) {
        __assert_fail("im",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/parser/wat-parser-internal.h"
                      ,0x55,
                      "Result<> wasm::WATParser::parseDefs(Ctx &, const std::vector<DefPos> &, MaybeResult<> (*)(Ctx &)) [Ctx = wasm::WATParser::ParseDefsCtx]"
                     );
      }
      MaybeResult<wasm::Ok>::MaybeResult
                ((MaybeResult<wasm::Ok> *)&err_1,
                 (MaybeResult<wasm::Ok> *)
                 ((long)&_val_1.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20));
      local_158 = MaybeResult<wasm::Ok>::getErr((MaybeResult<wasm::Ok> *)&err_1);
      bVar1 = local_158 != (Err *)0x0;
      if (bVar1) {
        wasm::Err::Err(&local_178,local_158);
        Result<wasm::Ok>::Result(__return_storage_ptr__,&local_178);
        wasm::Err::~Err(&local_178);
      }
      MaybeResult<wasm::Ok>::~MaybeResult((MaybeResult<wasm::Ok> *)&err_1);
      MaybeResult<wasm::Ok>::~MaybeResult
                ((MaybeResult<wasm::Ok> *)
                 ((long)&_val_1.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20));
    }
    if (!bVar1) {
      bVar1 = false;
    }
    MaybeResult<wasm::Ok>::~MaybeResult((MaybeResult<wasm::Ok> *)local_98);
    if (!bVar1) {
      bVar1 = false;
    }
    WithPosition<wasm::WATParser::ParseDefsCtx>::~WithPosition
              ((WithPosition<wasm::WATParser::ParseDefsCtx> *)
               ((long)&parsed.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20));
    if (bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_wasm::WATParser::DefPos_*,_std::vector<wasm::WATParser::DefPos,_std::allocator<wasm::WATParser::DefPos>_>_>
    ::operator++(&__end2);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<> parseDefs(Ctx& ctx,
                   const std::vector<DefPos>& defs,
                   MaybeResult<> (*parser)(Ctx&)) {
  for (auto& def : defs) {
    ctx.index = def.index;
    WithPosition with(ctx, def.pos);
    if (auto parsed = parser(ctx)) {
      CHECK_ERR(parsed);
    } else {
      auto im = import_(ctx);
      assert(im);
      CHECK_ERR(im);
    }
  }
  return Ok{};
}